

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
emplaceRealloc<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
          (SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *this,pointer pos,
          TransRangeSyntax *args,Type *args_1,ASTContext *args_2)

{
  TransRangeList *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  pointer ppEVar3;
  size_t sVar4;
  Expression *pEVar5;
  undefined4 uVar6;
  TransRangeList *__cur_1;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  long lVar11;
  ulong uVar12;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar1 = this->cap;
  if (uVar12 < uVar1 * 2) {
    uVar12 = uVar1 * 2;
  }
  if (0x333333333333333 - uVar1 < uVar1) {
    uVar12 = 0x333333333333333;
  }
  lVar11 = (long)pos - (long)this->data_;
  pTVar7 = (pointer)operator_new(uVar12 * 0x28);
  this_00 = (TransRangeList *)((long)pTVar7 + lVar11);
  ast::CoverageBinSymbol::TransRangeList::TransRangeList(this_00,args,args_1,args_2);
  pTVar10 = this->data_;
  pTVar8 = pTVar10 + this->len;
  pTVar9 = pTVar7;
  if (pTVar8 == pos) {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      uVar6 = *(undefined4 *)&pTVar10->field_0x24;
      pTVar9->repeatKind = pTVar10->repeatKind;
      *(undefined4 *)&pTVar9->field_0x24 = uVar6;
      ppEVar3 = (pTVar10->items)._M_ptr;
      sVar4 = (pTVar10->items)._M_extent._M_extent_value;
      pEVar5 = pTVar10->repeatTo;
      pTVar9->repeatFrom = pTVar10->repeatFrom;
      pTVar9->repeatTo = pEVar5;
      (pTVar9->items)._M_ptr = ppEVar3;
      (pTVar9->items)._M_extent._M_extent_value = sVar4;
      pTVar9 = pTVar9 + 1;
    }
  }
  else {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      args = *(TransRangeSyntax **)&pTVar10->repeatKind;
      *(TransRangeSyntax **)&pTVar9->repeatKind = args;
      ppEVar3 = (pTVar10->items)._M_ptr;
      sVar4 = (pTVar10->items)._M_extent._M_extent_value;
      pEVar5 = pTVar10->repeatTo;
      pTVar9->repeatFrom = pTVar10->repeatFrom;
      pTVar9->repeatTo = pEVar5;
      (pTVar9->items)._M_ptr = ppEVar3;
      (pTVar9->items)._M_extent._M_extent_value = sVar4;
      pTVar9 = pTVar9 + 1;
    }
    puVar2 = (undefined8 *)((long)pTVar7 + lVar11);
    for (; pos != pTVar8; pos = pos + 1) {
      puVar2[9] = *(undefined8 *)&pos->repeatKind;
      ppEVar3 = (pos->items)._M_ptr;
      sVar4 = (pos->items)._M_extent._M_extent_value;
      pEVar5 = pos->repeatTo;
      puVar2[7] = pos->repeatFrom;
      puVar2[8] = pEVar5;
      puVar2[5] = ppEVar3;
      puVar2[6] = sVar4;
      puVar2 = puVar2 + 5;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = uVar12;
  this->data_ = pTVar7;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}